

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O2

void __thiscall sznet::MinHeap<event>::checkHeap(MinHeap<event> *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint32_t uVar6;
  bool bVar7;
  
  uVar6 = this->m_size;
  do {
    uVar6 = uVar6 - 1;
    uVar4 = uVar6;
    if (uVar6 == 0) {
      return;
    }
    do {
      uVar1 = uVar4 - 1;
      uVar3 = (ulong)uVar4;
      bVar7 = uVar4 == 0;
      uVar4 = uVar4 - 1;
      uVar5 = (ulong)(uVar1 >> 1);
      if (bVar7) {
        uVar5 = 0;
      }
      iVar2 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar5],this->m_ptrArr[uVar3]);
      if (iVar2 == 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/../../sznet/ds/MinHeap.h"
                      ,0xe9,"void sznet::MinHeap<event>::checkHeap() [T = event]");
      }
    } while ((int)uVar5 != 0);
  } while( true );
}

Assistant:

void checkHeap()
	{
		for (uint32_t index = (m_size - 1); index > 0; --index)
		{
			uint32_t curIndex = index;
			while (true)
			{
				// 当前节点下标的爸爸下标
				uint32_t parent_index = parent(curIndex);
				// 判断父亲节点是否比当前节点小
				auto r = m_pCmpFunc(m_ptrArr[parent_index], m_ptrArr[curIndex]);
				if (r == 1)
				{
					// 不要那就错了
					assert(0);
				}
				if (parent_index == 0)
				{
					break;
				}
				--curIndex;
			}
		}
	}